

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::AddBuildExportExportSet(cmGlobalGenerator *this,cmExportBuildFileGenerator *gen)

{
  mapped_type pcVar1;
  char *pcVar2;
  mapped_type *ppcVar3;
  allocator local_71;
  key_type local_70;
  allocator local_39;
  key_type local_38;
  mapped_type local_18;
  cmExportBuildFileGenerator *gen_local;
  cmGlobalGenerator *this_local;
  
  local_18 = gen;
  gen_local = (cmExportBuildFileGenerator *)this;
  pcVar2 = cmExportFileGenerator::GetMainExportFileName(&gen->super_cmExportFileGenerator);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,pcVar2,&local_39);
  ppcVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>_>
            ::operator[](&this->BuildExportSets,&local_38);
  *ppcVar3 = gen;
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  pcVar1 = local_18;
  pcVar2 = cmExportFileGenerator::GetMainExportFileName(&local_18->super_cmExportFileGenerator);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,pcVar2,&local_71);
  ppcVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>_>
            ::operator[](&this->BuildExportExportSets,&local_70);
  *ppcVar3 = pcVar1;
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  return;
}

Assistant:

void cmGlobalGenerator::AddBuildExportExportSet(
  cmExportBuildFileGenerator* gen)
{
  this->BuildExportSets[gen->GetMainExportFileName()] = gen;
  this->BuildExportExportSets[gen->GetMainExportFileName()] = gen;
}